

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_gsub(lua_State *L)

{
  char cVar1;
  byte bVar2;
  lua_State *L_00;
  char cVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  char *p;
  char *e;
  char *pcVar7;
  ushort **ppuVar8;
  char *pcVar9;
  ulong uVar10;
  lua_Integer n;
  size_t lp;
  lua_State *local_22b0;
  char *local_22a8;
  ulong local_22a0;
  size_t local_2298;
  lua_Integer local_2290;
  size_t srcl;
  ulong local_2280;
  MatchState ms;
  luaL_Buffer b;
  ulong uVar11;
  
  pcVar6 = luaL_checklstring(L,1,&srcl);
  p = luaL_checklstring(L,2,&lp);
  uVar4 = lua_type(L,3);
  local_2290 = luaL_optinteger(L,4,srcl + 1);
  cVar1 = *p;
  local_22a0 = (ulong)uVar4;
  if (3 < uVar4 - 3) {
    luaL_argerror(L,3,"string/function/table expected");
  }
  luaL_buffinit(L,&b);
  if (cVar1 == '^') {
    p = p + 1;
    lp = lp - 1;
  }
  ms.matchdepth = 200;
  ms.src_end = pcVar6 + srcl;
  ms.p_end = p + lp;
  pcVar9 = (char *)0x0;
  n = 0;
  local_22b0 = L;
  local_22a8 = p;
  ms.src_init = pcVar6;
  ms.L = L;
  do {
    e = pcVar6;
    if (local_2290 <= n) break;
    ms.level = '\0';
    e = match(&ms,pcVar6,p);
    L_00 = ms.L;
    if (e == pcVar9 || e == (char *)0x0) {
      e = pcVar6;
      if (ms.src_end <= pcVar6) break;
      if (b.size <= b.n) {
        luaL_prepbuffsize(&b,1);
      }
      e = pcVar6 + 1;
      b.b[b.n] = *pcVar6;
      b.n = b.n + 1;
    }
    else {
      n = n + 1;
      pcVar9 = e;
      if ((int)local_22a0 == 5) {
        push_onecapture(&ms,0,pcVar6,e);
        lua_gettable(L_00,3);
      }
      else {
        if ((int)local_22a0 != 6) {
          pcVar7 = lua_tolstring(ms.L,3,&local_2280);
          local_2298 = (long)e - (long)pcVar6;
          uVar10 = 0;
          while (p = local_22a8, uVar10 < local_2280) {
            cVar3 = pcVar7[uVar10];
            if (cVar3 == '%') {
              uVar11 = uVar10 + 1;
              ppuVar8 = __ctype_b_loc();
              bVar2 = pcVar7[uVar10 + 1];
              if ((*(byte *)((long)*ppuVar8 + (ulong)bVar2 * 2 + 1) & 8) == 0) {
                if (bVar2 != 0x25) {
                  luaL_error(L_00,"invalid use of \'%c\' in replacement string",0x25);
                }
                if (b.size <= b.n) {
                  luaL_prepbuffsize(&b,1);
                }
                b.b[b.n] = pcVar7[uVar11];
                b.n = b.n + 1;
              }
              else if (bVar2 == 0x30) {
                luaL_addlstring(&b,pcVar6,local_2298);
              }
              else {
                push_onecapture(&ms,(char)bVar2 + -0x31,pcVar6,e);
                luaL_tolstring(L_00,-1,(size_t *)0x0);
                lua_rotate(L_00,-2,-1);
                lua_settop(L_00,-2);
                luaL_addvalue(&b);
              }
            }
            else {
              if (b.size <= b.n) {
                luaL_prepbuffsize(&b,1);
                cVar3 = pcVar7[uVar10];
              }
              b.b[b.n] = cVar3;
              uVar11 = uVar10;
              b.n = b.n + 1;
            }
            uVar10 = uVar11 + 1;
          }
          goto LAB_0011b245;
        }
        lua_pushvalue(ms.L,3);
        iVar5 = push_captures(&ms,pcVar6,e);
        lua_callk(L_00,iVar5,1,0,(lua_KFunction)0x0);
      }
      iVar5 = lua_toboolean(L_00,-1);
      if (iVar5 == 0) {
        lua_settop(L_00,-2);
        lua_pushlstring(L_00,pcVar6,(long)e - (long)pcVar6);
      }
      else {
        iVar5 = lua_isstring(L_00,-1);
        if (iVar5 == 0) {
          iVar5 = lua_type(L_00,-1);
          pcVar6 = lua_typename(L_00,iVar5);
          luaL_error(L_00,"invalid replacement value (a %s)",pcVar6);
        }
      }
      luaL_addvalue(&b);
    }
LAB_0011b245:
    pcVar6 = e;
  } while (cVar1 != '^');
  luaL_addlstring(&b,e,(long)ms.src_end - (long)e);
  luaL_pushresult(&b);
  lua_pushinteger(local_22b0,n);
  return 2;
}

Assistant:

static int str_gsub (lua_State *L) {
  size_t srcl, lp;
  const char *src = luaL_checklstring(L, 1, &srcl);  /* subject */
  const char *p = luaL_checklstring(L, 2, &lp);  /* pattern */
  const char *lastmatch = NULL;  /* end of last match */
  int tr = lua_type(L, 3);  /* replacement type */
  lua_Integer max_s = luaL_optinteger(L, 4, srcl + 1);  /* max replacements */
  int anchor = (*p == '^');
  lua_Integer n = 0;  /* replacement count */
  MatchState ms;
  luaL_Buffer b;
  luaL_argcheck(L, tr == LUA_TNUMBER || tr == LUA_TSTRING ||
                   tr == LUA_TFUNCTION || tr == LUA_TTABLE, 3,
                      "string/function/table expected");
  luaL_buffinit(L, &b);
  if (anchor) {
    p++; lp--;  /* skip anchor character */
  }
  prepstate(&ms, L, src, srcl, p, lp);
  while (n < max_s) {
    const char *e;
    reprepstate(&ms);  /* (re)prepare state for new match */
    if ((e = match(&ms, src, p)) != NULL && e != lastmatch) {  /* match? */
      n++;
      add_value(&ms, &b, src, e, tr);  /* add replacement to buffer */
      src = lastmatch = e;
    }
    else if (src < ms.src_end)  /* otherwise, skip one character */
      luaL_addchar(&b, *src++);
    else break;  /* end of subject */
    if (anchor) break;
  }
  luaL_addlstring(&b, src, ms.src_end-src);
  luaL_pushresult(&b);
  lua_pushinteger(L, n);  /* number of substitutions */
  return 2;
}